

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  pointer pcVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  undefined1 linkLineComputer_00 [8];
  bool bVar4;
  undefined7 in_register_00000031;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> linkLineComputer;
  string extraFlags;
  string linkLanguage;
  string linkRuleVar;
  undefined1 local_100 [8];
  undefined1 local_f8 [32];
  pointer local_d8;
  pointer local_d0;
  pointer local_c8;
  char *local_c0;
  undefined1 local_b8 [8];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000031,relink) == 0) {
    pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
              ((string *)local_f8,&this->super_cmMakefileTargetGenerator);
    bVar4 = requireDeviceLinking(pcVar2,(cmLocalGenerator *)pcVar3,(string *)local_f8);
    pcVar1 = local_f8 + 0x10;
    if ((pointer)local_f8._0_8_ != pcVar1) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    if (bVar4) {
      local_f8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"CMAKE_CUDA_DEVICE_LINK_LIBRARY","");
      WriteDeviceLibraryRules(this,(string *)local_f8,false);
      if ((pointer)local_f8._0_8_ != pcVar1) {
        operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
      }
    }
  }
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)local_f8,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage(&local_90,pcVar2,(string *)local_f8);
  pcVar1 = local_f8 + 0x10;
  if ((pointer)local_f8._0_8_ != pcVar1) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  local_f8._0_8_ = (pointer)0x6;
  local_f8._8_8_ = "CMAKE_";
  local_f8._16_8_ = 0;
  local_f8._24_8_ = local_90._M_string_length;
  local_d8 = (pointer)local_90._M_dataplus._M_p;
  local_d0 = (pointer)0x0;
  local_c8 = (pointer)0x15;
  local_c0 = "_CREATE_SHARED_MODULE";
  local_b8 = (undefined1  [8])0x0;
  views._M_len = 3;
  views._M_array = (iterator)local_f8;
  cmCatViews(&local_50,views);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,&local_b0,&local_90);
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  local_f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"CMAKE_MODULE_LINKER_FLAGS","")
  ;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_70,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar3,&local_b0,(string *)local_f8,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_f8._0_8_ != pcVar1) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_70,(cmLocalGenerator *)pcVar3);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_f8,(cmStateSnapshot *)&local_70);
  cmMakefileTargetGenerator::CreateLinkLineComputer
            ((cmMakefileTargetGenerator *)local_100,(cmOutputConverter *)this,
             (cmStateDirectory *)pcVar3);
  linkLineComputer_00 = local_100;
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)local_f8,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AppendModuleDefinitionFlag
            ((cmLocalGenerator *)pcVar3,&local_b0,pcVar2,(cmLinkLineComputer *)linkLineComputer_00,
             (string *)local_f8);
  if ((pointer)local_f8._0_8_ != pcVar1) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  bVar4 = cmLocalGenerator::AppendLWYUFlags
                    ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                     &local_b0,
                     (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,&local_90);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.UseLWYU = bVar4;
  WriteLibraryRules(this,&local_50,&local_b0,relink);
  if (local_100 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_100)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules(bool relink)
{
  if (!relink) {
    const bool requiresDeviceLinking = requireDeviceLinking(
      *this->GeneratorTarget, *this->LocalGenerator, this->GetConfigName());
    if (requiresDeviceLinking) {
      this->WriteDeviceLibraryRules("CMAKE_CUDA_DEVICE_LINK_LIBRARY", relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  std::string linkRuleVar =
    cmStrCat("CMAKE_", linkLanguage, "_CREATE_SHARED_MODULE");

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MODULE_LINKER_FLAGS", this->GetConfigName());

  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory());

  this->LocalGenerator->AppendModuleDefinitionFlag(
    extraFlags, this->GeneratorTarget, linkLineComputer.get(),
    this->GetConfigName());

  this->UseLWYU = this->LocalGenerator->AppendLWYUFlags(
    extraFlags, this->GeneratorTarget, linkLanguage);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}